

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-netlink.c
# Opt level: O0

int rops_pt_init_destroy_netlink
              (lws_context *context,lws_context_creation_info *info,lws_context_per_thread *pt,
              int destroy)

{
  int iVar1;
  lws_log_cx *plVar2;
  lws *wsi_00;
  ssize_t sVar3;
  int *piVar4;
  int local_b0;
  int ret;
  int n;
  lws *wsi;
  iovec iov;
  msghdr msg;
  nl_req_s req;
  sockaddr_nl sanl;
  int destroy_local;
  lws_context_per_thread *pt_local;
  lws_context_creation_info *info_local;
  lws_context *context_local;
  
  local_b0 = 1;
  if (destroy == 0) {
    if (context->netlink == (lws *)0x0) {
      if (context->pt < pt) {
        context_local._4_4_ = 0;
      }
      else {
        plVar2 = lwsl_context_get_cx(context);
        _lws_log_cx(plVar2,lws_log_prepend_context,context,8,"rops_pt_init_destroy_netlink",
                    "creating netlink skt");
        wsi_00 = __lws_wsi_create_with_role
                           (context,(int)(((long)pt - (long)context->pt) / 0x1a0),&role_ops_netlink,
                            (lws_log_cx_t *)0x0);
        if (wsi_00 != (lws *)0x0) {
          iVar1 = socket(0x10,3,0);
          (wsi_00->desc).sockfd = iVar1;
          if ((wsi_00->desc).sockfd == -1) {
            plVar2 = lwsl_context_get_cx(context);
            _lws_log_cx(plVar2,lws_log_prepend_context,context,1,"rops_pt_init_destroy_netlink",
                        "unable to open netlink");
          }
          else {
            lws_plat_set_nonblocking((wsi_00->desc).sockfd);
            __lws_lc_tag(context,context->lcg + 1,&wsi_00->lc,"netlink");
            memset(&req.gen.rtm_table,0,0xc);
            req.gen.rtm_table = '\x10';
            req.gen.rtm_protocol = '\0';
            req.gen.rtm_flags = getpid();
            iVar1 = bind((wsi_00->desc).sockfd,(sockaddr *)&req.gen.rtm_table,0xc);
            if (iVar1 < 0) {
              plVar2 = lwsl_context_get_cx(context);
              _lws_log_cx(plVar2,lws_log_prepend_context,context,2,"rops_pt_init_destroy_netlink",
                          "netlink bind failed");
              local_b0 = 0;
            }
            else {
              context->netlink = wsi_00;
              iVar1 = lws_wsi_inject_to_loop(pt,wsi_00);
              if (iVar1 == 0) {
                memset(&req.gen.rtm_table,0,0xc);
                memset(&iov.iov_len,0,0x38);
                memset(&msg.field_0x34,0,0x1c);
                req.gen.rtm_table = '\x10';
                req.gen.rtm_protocol = '\0';
                msg._52_4_ = 0x1c;
                req.hdr.nlmsg_len = 1;
                req.hdr._4_4_ = getpid();
                req.hdr.nlmsg_seq._0_1_ = 0x11;
                req.hdr.nlmsg_pid._0_1_ = 0xfd;
                wsi = (lws *)&msg.field_0x34;
                iov.iov_base = (void *)(ulong)(uint)msg._52_4_;
                msg._8_8_ = &wsi;
                msg.msg_iov = (iovec *)0x1;
                iov.iov_len = (size_t)&req.gen.rtm_table;
                msg.msg_name._0_4_ = 0xc;
                sVar3 = sendmsg((wsi_00->desc).sockfd,(msghdr *)&iov.iov_len,0);
                if ((int)sVar3 < 0) {
                  plVar2 = lwsl_context_get_cx(context);
                  piVar4 = __errno_location();
                  _lws_log_cx(plVar2,lws_log_prepend_context,context,4,
                              "rops_pt_init_destroy_netlink",
                              "rt dump req failed... permissions? errno %d",*piVar4);
                }
                plVar2 = lwsl_context_get_cx(context);
                _lws_log_cx(plVar2,lws_log_prepend_context,context,0x10,
                            "rops_pt_init_destroy_netlink","starting netlink coldplug wait");
                return 0;
              }
            }
            __lws_lc_untag((wsi_00->a).context,&wsi_00->lc);
            close((wsi_00->desc).sockfd);
          }
          lws_realloc(wsi_00,0,"lws_free");
        }
        context_local._4_4_ = local_b0;
      }
    }
    else {
      context_local._4_4_ = 0;
    }
  }
  else {
    _lws_route_table_empty(pt);
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

int
rops_pt_init_destroy_netlink(struct lws_context *context,
			     const struct lws_context_creation_info *info,
			     struct lws_context_per_thread *pt, int destroy)
{
	struct sockaddr_nl sanl;
	struct nl_req_s req;
	struct msghdr msg;
	struct iovec iov;
	struct lws *wsi;
	int n, ret = 1;

	if (destroy) {

		/*
		 * pt netlink wsi closed + freed as part of pt's destroy
		 * wsi mass close, just need to take down the routing table
		 */
		_lws_route_table_empty(pt);

		return 0;
	}

	if (context->netlink)
		return 0;

	if (pt > &context->pt[0])
		/* we can only have one netlink socket */
		return 0;

	lwsl_cx_info(context, "creating netlink skt");

	/*
	 * We want a netlink socket per pt as well
	 */

	lws_context_lock(context, __func__);
	wsi = __lws_wsi_create_with_role(context, (int)(pt - &context->pt[0]),
				       &role_ops_netlink, NULL);
	lws_context_unlock(context);
	if (!wsi)
		goto bail;

	wsi->desc.sockfd = socket(AF_NETLINK, SOCK_RAW, NETLINK_ROUTE);
	if (wsi->desc.sockfd == LWS_SOCK_INVALID) {
		lwsl_cx_err(context, "unable to open netlink");
		goto bail1;
	}

	lws_plat_set_nonblocking(wsi->desc.sockfd);

	__lws_lc_tag(context, &context->lcg[LWSLCG_VHOST], &wsi->lc,
			"netlink");

	memset(&sanl, 0, sizeof(sanl));
	sanl.nl_family		= AF_NETLINK;
	sanl.nl_pid		= (uint32_t)getpid();
	sanl.nl_groups		= (1 << (RTNLGRP_LINK - 1)) |
				  (1 << (RTNLGRP_IPV4_ROUTE - 1)) |
				  (1 << (RTNLGRP_IPV4_IFADDR - 1))
#if defined(LWS_WITH_IPV6)
				  | (1 << (RTNLGRP_IPV6_ROUTE - 1)) |
				    (1 << (RTNLGRP_IPV6_IFADDR - 1))
#endif
				 ;

	if (lws_fi(&context->fic, "netlink_bind") ||
	    bind(wsi->desc.sockfd, (struct sockaddr*)&sanl, sizeof(sanl)) < 0) {
		lwsl_cx_warn(context, "netlink bind failed");
		ret = 0; /* some systems deny access, just ignore */
		goto bail2;
	}

	context->netlink = wsi;
	if (lws_wsi_inject_to_loop(pt, wsi))
		goto bail2;

/*	if (lws_change_pollfd(wsi, 0, LWS_POLLIN)) {
		lwsl_err("%s: pollfd in fail\n", __func__);
		goto bail2;
	}
*/
	/*
	 * Since we're starting the PT, ask to be sent all the existing routes.
	 *
	 * This requires CAP_ADMIN, or root... we do this early before dropping
	 * privs
	 */

	memset(&sanl, 0, sizeof(sanl));
	memset(&msg, 0, sizeof(msg));
	memset(&req, 0, sizeof(req));

	sanl.nl_family		= AF_NETLINK;

	req.hdr.nlmsg_len	= NLMSG_LENGTH(sizeof(req.gen));
	req.hdr.nlmsg_type	= RTM_GETROUTE;
	req.hdr.nlmsg_flags	= NLM_F_REQUEST | NLM_F_DUMP;
	req.hdr.nlmsg_seq	= 1;
	req.hdr.nlmsg_pid	= (uint32_t)getpid();
	req.gen.rtm_family	= AF_PACKET;
	req.gen.rtm_table	= RT_TABLE_DEFAULT;

	iov.iov_base		= &req;
	iov.iov_len		= req.hdr.nlmsg_len;
	msg.msg_iov		= &iov;
	msg.msg_iovlen		= 1;
	msg.msg_name		= &sanl;
	msg.msg_namelen		= sizeof(sanl);

	n = (int)sendmsg(wsi->desc.sockfd, (struct msghdr *)&msg, 0);
	if (n < 0) {
		lwsl_cx_notice(context, "rt dump req failed... permissions? errno %d",
				LWS_ERRNO);
	}

	/*
	 * Responses are going to come asynchronously, let's block moving
	 * off state IFACE_COLDPLUG until we have had them.  This is important
	 * since if we don't hold there, when we do get the responses we may
	 * cull any ongoing connections as unroutable otherwise
	 */

	lwsl_cx_debug(context, "starting netlink coldplug wait");

	return 0;

bail2:
	__lws_lc_untag(wsi->a.context, &wsi->lc);
	compatible_close(wsi->desc.sockfd);
bail1:
	lws_free(wsi);
bail:
	return ret;
}